

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O0

void * liblogger::LogTcpServer::Run(void *arg)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int nclient;
  socklen_t addr_len;
  sockaddr_in addr;
  int ret;
  pollfd fds [2];
  bool busy;
  LogTcpServer *self;
  socklen_t local_40 [2];
  value_type_conflict3 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  pollfd local_28;
  undefined4 local_20;
  undefined2 local_1c;
  ushort local_1a;
  byte local_11;
  long local_10;
  
  local_11 = 1;
  local_10 = in_RDI;
  while( true ) {
    if ((local_11 & 1) == 0) {
      return (void *)0x0;
    }
    local_28.fd = *(int *)(local_10 + 0x54);
    local_28.events = 1;
    local_28.revents = 0;
    local_20 = *(undefined4 *)(local_10 + 0x58);
    local_1c = 1;
    local_1a = 0;
    iVar1 = poll(&local_28,2,0);
    if (iVar1 < 0) break;
    if ((local_28.revents & 1U) != 0) {
      local_40[0] = 0x10;
      iVar2 = accept(*(int *)(local_10 + 0x54),(sockaddr *)(local_40 + 1),local_40);
      if (-1 < iVar2) {
        Lock((LogTcpServer *)0x1acbde);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        Unlock((LogTcpServer *)0x1acbfb);
      }
    }
    if ((local_1a & 1) != 0) {
      local_11 = 0;
    }
  }
  __errno_location();
  abort();
}

Assistant:

void *LogTcpServer::Run(void *arg)
{
	LogTcpServer *self = (LogTcpServer *) arg;

	bool busy = true;
	while(busy)
	{
		struct pollfd fds[2];

		fds[0].fd = self->m_acceptfd;
		fds[0].events = POLLIN;
		fds[0].revents = 0;

		fds[1].fd = self->m_ctlfd[0];
		fds[1].events = POLLIN;
		fds[1].revents = 0;

		int ret = poll(fds, 2, 0);
		if (ret < 0)
		{
			switch(errno)
			{
				default:
					abort();
			}
		}

		if ( (fds[0].revents & POLLIN) ) {
			//Accept
			struct sockaddr_in addr;
			socklen_t addr_len = sizeof(addr);
			int nclient = accept(self->m_acceptfd, (struct sockaddr *) &addr, &addr_len);
			if (nclient >= 0)
			{
				self->Lock();
				self->m_list.push_back(nclient);
				self->Unlock();
			}
		}

		//Check eventfd and exit if it has data
		if ( (fds[1].revents & POLLIN) ) {
			busy = false;
		}

	}

	return NULL;
}